

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O2

int count_lines(FILE *fp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  fpos_t orig_pos;
  
  if (fp != (FILE *)0x0) {
    fgetpos((FILE *)fp,(fpos_t *)&orig_pos);
    rewind((FILE *)fp);
    uVar4 = 0xfffffffe;
    iVar2 = 0;
    do {
      iVar3 = iVar2;
      iVar1 = fgetc((FILE *)fp);
      uVar4 = uVar4 + 1;
      iVar2 = (uint)(iVar1 == 10) + iVar3;
    } while (iVar1 != -1);
    fsetpos((FILE *)fp,(fpos_t *)&orig_pos);
    iVar2 = ferror((FILE *)fp);
    return -(uint)(iVar2 != 0) | iVar3 - ((int)~uVar4 >> 0x1f);
  }
  return -1;
}

Assistant:

int count_lines(FILE *fp) {
    int lines = 0;
    int ch_count = -1;
    int ch;

    fpos_t orig_pos;

    if (fp == NULL)
        return -1;

    fgetpos(fp, &orig_pos);
    rewind(fp);

    do {
        ch = fgetc(fp);
        ch_count++;
        if (ch == '\n')
            lines++;
    } while (ch != EOF);

    fsetpos(fp, &orig_pos);

    if (ch_count > 0)
        lines++;

    if (ferror(fp) != 0)
        return -1;

    return lines;
}